

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O1

void just::console::text_color(color c_)

{
  char *pcVar1;
  
  if (impl::color<void>::black == c_._id) {
    pcVar1 = "\x1b[30m";
  }
  else if (impl::color<void>::red == c_._id) {
    pcVar1 = "\x1b[31m";
  }
  else if (impl::color<void>::green == c_._id) {
    pcVar1 = "\x1b[32m";
  }
  else if (impl::color<void>::yellow == c_._id) {
    pcVar1 = "\x1b[33m";
  }
  else if (impl::color<void>::blue == c_._id) {
    pcVar1 = "\x1b[34m";
  }
  else if (impl::color<void>::magenta == c_._id) {
    pcVar1 = "\x1b[35m";
  }
  else if (impl::color<void>::cyan == c_._id) {
    pcVar1 = "\x1b[36m";
  }
  else {
    if (impl::color<void>::gray != c_._id) {
      if (impl::color<void>::bright_red == c_._id) {
        pcVar1 = "\x1b[1;31m";
      }
      else if (impl::color<void>::bright_green == c_._id) {
        pcVar1 = "\x1b[1;32m";
      }
      else if (impl::color<void>::bright_yellow == c_._id) {
        pcVar1 = "\x1b[1;33m";
      }
      else if (impl::color<void>::bright_blue == c_._id) {
        pcVar1 = "\x1b[1;34m";
      }
      else if (impl::color<void>::bright_magenta == c_._id) {
        pcVar1 = "\x1b[1;35m";
      }
      else if (impl::color<void>::bright_cyan == c_._id) {
        pcVar1 = "\x1b[1;36m";
      }
      else {
        if (impl::color<void>::white != c_._id) {
          __assert_fail("!\"Invalid color value\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/console.hpp"
                        ,0xbf,"void just::console::text_color(color)");
        }
        pcVar1 = "\x1b[1;37m";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,7);
      return;
    }
    pcVar1 = "\x1b[37m";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,5);
  return;
}

Assistant:

bool operator==(color c_) const { return _id == c_._id; }